

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_IntegerReturnValue_Test::TEST_MockReturnValueTest_IntegerReturnValue_Test
          (TEST_MockReturnValueTest_IntegerReturnValue_Test *this)

{
  TEST_MockReturnValueTest_IntegerReturnValue_Test *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupMockReturnValueTest::TEST_GROUP_CppUTestGroupMockReturnValueTest
            (&this->super_TEST_GROUP_CppUTestGroupMockReturnValueTest);
  (this->super_TEST_GROUP_CppUTestGroupMockReturnValueTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_MockReturnValueTest_IntegerReturnValue_Test_00342908;
  return;
}

Assistant:

TEST(MockReturnValueTest, IntegerReturnValue)
{
    int expected_value = 1;
    mock().expectOneCall("foo").andReturnValue(1);
    MockActualCall& actual_call = mock().actualCall("foo");

    LONGS_EQUAL(expected_value, actual_call.returnValue().getIntValue());
    LONGS_EQUAL(expected_value, actual_call.returnIntValue());

    LONGS_EQUAL(expected_value, mock().returnValue().getIntValue());
    LONGS_EQUAL(expected_value, mock().intReturnValue());
}